

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model_replaceImportedUnitsByIndex_Test::TestBody(Model_replaceImportedUnitsByIndex_Test *this)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_2a0 [8];
  Message local_298 [8];
  unsigned_long local_290 [2];
  undefined1 local_280 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_250 [8];
  Message local_248 [15];
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__1;
  Message local_220 [8];
  unsigned_long local_218 [2];
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1d8 [8];
  Message local_1d0 [15];
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_;
  Message local_1a8 [8];
  unsigned_long local_1a0 [2];
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  undefined1 local_130 [8];
  ImportSourcePtr import2;
  ImportSourcePtr import1;
  string local_108 [32];
  undefined1 local_e8 [8];
  UnitsPtr myImportedUnits2;
  string local_d0 [32];
  undefined1 local_b0 [8];
  UnitsPtr myConcreteUnits2;
  string local_98 [32];
  undefined1 local_78 [8];
  UnitsPtr myImportedUnits1;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  UnitsPtr myConcreteUnits1;
  ModelPtr model;
  Model_replaceImportedUnitsByIndex_Test *this_local;
  
  libcellml::Model::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"myConcreteUnits1",&local_51);
  libcellml::Units::create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"myImportedUnits1",
             (allocator<char> *)
             ((long)&myConcreteUnits2.
                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::Units::create((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&myConcreteUnits2.
                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"myConcreteUnits2",
             (allocator<char> *)
             ((long)&myImportedUnits2.
                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::Units::create((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&myImportedUnits2.
                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"myImportedUnits2",
             (allocator<char> *)
             ((long)&import1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&import1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::ImportSource::create();
  libcellml::ImportSource::create();
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&import2.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"import1.cellml",&local_151);
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"import2.cellml",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_78);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar4 + 0x10));
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_e8);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar4 + 0x10));
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&myConcreteUnits1.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&myConcreteUnits1.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  local_1a0[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &myConcreteUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_1a0[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_190,"size_t(2)","model->unitsCount()",local_1a0 + 1,local_1a0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x3af,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&myConcreteUnits1.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar2 = libcellml::Model::replaceUnits((ulong)peVar5,(shared_ptr *)0x0);
  local_1c1 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_1c0,
               "model->replaceUnits(0, myImportedUnits1)","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x3b2,pcVar6);
    testing::internal::AssertHelper::operator=(local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_218[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &myConcreteUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_218[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_208,"size_t(2)","model->unitsCount()",local_218 + 1,local_218)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(local_220);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x3b3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&myConcreteUnits1.
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar2 = libcellml::Model::replaceUnits((ulong)peVar5,(shared_ptr *)0x1);
  local_239 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_238,
               "model->replaceUnits(1, myConcreteUnits2)","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x3b6,pcVar6);
    testing::internal::AssertHelper::operator=(local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(local_250);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_290[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &myConcreteUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_290[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_280,"size_t(2)","model->unitsCount()",local_290 + 1,local_290)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(local_298);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              (local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x3b7,pcVar6);
    testing::internal::AssertHelper::operator=(local_2a0,local_298);
    testing::internal::AssertHelper::~AssertHelper(local_2a0);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_130);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)
             &import2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_e8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_b0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_78);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &myConcreteUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Model, replaceImportedUnitsByIndex)
{
    auto model = libcellml::Model::create();
    auto myConcreteUnits1 = libcellml::Units::create("myConcreteUnits1");
    auto myImportedUnits1 = libcellml::Units::create("myImportedUnits1");
    auto myConcreteUnits2 = libcellml::Units::create("myConcreteUnits2");
    auto myImportedUnits2 = libcellml::Units::create("myImportedUnits2");

    auto import1 = libcellml::ImportSource::create();
    auto import2 = libcellml::ImportSource::create();

    import1->setUrl("import1.cellml");
    import2->setUrl("import2.cellml");

    myImportedUnits1->setImportSource(import1);
    myImportedUnits2->setImportSource(import2);

    model->addUnits(myConcreteUnits1);
    model->addUnits(myImportedUnits2);

    EXPECT_EQ(size_t(2), model->unitsCount());

    // REPLACE concrete -> imported by index.
    EXPECT_TRUE(model->replaceUnits(0, myImportedUnits1));
    EXPECT_EQ(size_t(2), model->unitsCount());

    // REPLACE imported -> concrete by index.
    EXPECT_TRUE(model->replaceUnits(1, myConcreteUnits2));
    EXPECT_EQ(size_t(2), model->unitsCount());
}